

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O0

void __thiscall
wabt::BindingHash::CallCallbacks
          (BindingHash *this,ValueTypeVector *duplicates,DuplicateCallback *callback)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  *__args;
  bool bVar1;
  reference pppVar2;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  local_58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **local_50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
  **local_48;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  local_40;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  local_38;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  first;
  const_iterator end;
  const_iterator iter;
  DuplicateCallback *callback_local;
  ValueTypeVector *duplicates_local;
  BindingHash *this_local;
  
  end = std::
        vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
        ::begin(duplicates);
  first._M_current =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
        **)std::
           vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
           ::end(duplicates);
  do {
    bVar1 = __gnu_cxx::operator!=(&end,&first);
    if (!bVar1) {
      return;
    }
    local_40._M_current =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
          **)std::
             vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
             ::begin(duplicates);
    local_48 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
                **)std::
                   vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
                   ::end(duplicates);
    local_50 = end._M_current;
    local_38 = std::
               find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const*const*,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,wabt::BindingHash::CallCallbacks(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>const&,std::function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>)const::__0>
                         (local_40,(__normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                                    )local_48,end._M_current);
    bVar1 = __gnu_cxx::operator==(&local_38,&end);
    if (!bVar1) {
      local_58._M_current =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>
            **)std::
               vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
               ::end(duplicates);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_58);
      if (!bVar1) {
        __assert_fail("first != duplicates.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binding-hash.cc"
                      ,0x56,
                      "void wabt::BindingHash::CallCallbacks(const ValueTypeVector &, DuplicateCallback) const"
                     );
      }
      pppVar2 = __gnu_cxx::
                __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                ::operator*(&local_38);
      __args = *pppVar2;
      pppVar2 = __gnu_cxx::
                __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
                ::operator*(&end);
      std::
      function<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&)>
      ::operator()(callback,__args,*pppVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*const_*,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

void BindingHash::CallCallbacks(const ValueTypeVector& duplicates,
                                DuplicateCallback callback) const {
  // Loop through all duplicates in order, and call callback with first
  // occurrence.
  for (auto iter = duplicates.begin(), end = duplicates.end(); iter != end;
       ++iter) {
    auto first = std::find_if(duplicates.begin(), duplicates.end(),
                              [iter](const value_type* x) -> bool {
                                return x->first == (*iter)->first;
                              });
    if (first == iter) {
      continue;
    }
    assert(first != duplicates.end());
    callback(**first, **iter);
  }
}